

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

void duckdb::IntegralCompressFunction<unsigned_long,unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  undefined8 uVar2;
  idx_t count;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  allocate_function_ptr_t p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar7;
  byte bVar8;
  char cVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  SelectionVector *pSVar12;
  reference pvVar13;
  VectorBuffer *pVVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  idx_t iVar17;
  idx_t iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t idx_in_entry;
  ulong uVar23;
  optional_idx dict_size;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_90;
  buffer_ptr<VectorBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar13 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  uVar2 = *(undefined8 *)pvVar13->data;
  pvVar13 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = pvVar13->vector_type;
  cVar9 = (char)uVar2;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar3 = result->data;
    pdVar4 = pvVar13->data;
    FlatVector::VerifyFlatVector(pvVar13);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar18 = 0;
        do {
          pdVar3[iVar18] = (char)*(undefined4 *)(pdVar4 + iVar18 * 8) - cVar9;
          iVar18 = iVar18 + 1;
        } while (count != iVar18);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar5 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar19 = 0;
        uVar23 = 0;
        do {
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
LAB_008f6671:
            uVar20 = uVar23;
            if (uVar23 < uVar21) {
              do {
                pdVar3[uVar23] = (char)*(undefined4 *)(pdVar4 + uVar23 * 8) - cVar9;
                uVar23 = uVar23 + 1;
                uVar20 = uVar21;
              } while (uVar21 != uVar23);
            }
          }
          else {
            uVar7 = puVar5[uVar19];
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
            uVar20 = uVar21;
            if (uVar7 != 0) {
              if (uVar7 == 0xffffffffffffffff) goto LAB_008f6671;
              uVar20 = uVar23;
              if (uVar23 < uVar21) {
                uVar22 = 0;
                do {
                  if ((uVar7 >> (uVar22 & 0x3f) & 1) != 0) {
                    pdVar3[uVar22 + uVar23] =
                         (char)*(undefined4 *)(pdVar4 + uVar22 * 8 + uVar23 * 8) - cVar9;
                  }
                  uVar22 = uVar22 + 1;
                  uVar20 = uVar21;
                } while (uVar21 - uVar23 != uVar22);
              }
            }
          }
          uVar19 = uVar19 + 1;
          uVar23 = uVar20;
        } while (uVar19 != count + 0x3f >> 6);
      }
    }
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pvVar13);
      pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar13->buffer);
      local_78.sel = (SelectionVector *)pVVar14[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar18 = optional_idx::GetIndex((optional_idx *)&local_78), iVar18 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(pvVar13);
        pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar13->auxiliary);
        if (*(char *)&pVVar14[1]._vptr_VectorBuffer == '\0') {
          local_90 = (Vector *)(pVVar14 + 1);
          pdVar3 = result->data;
          pdVar4 = pVVar14[1].data.pointer;
          local_88 = &pvVar13->buffer;
          iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
          FlatVector::VerifyFlatVector(local_90);
          FlatVector::VerifyFlatVector(result);
          puVar5 = (unsigned_long *)pVVar14[1].data.allocated_size;
          if (puVar5 == (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              iVar17 = 0;
              do {
                pdVar3[iVar17] = (char)*(undefined4 *)(pdVar4 + iVar17 * 8) - cVar9;
                iVar17 = iVar17 + 1;
              } while (iVar18 != iVar17);
            }
          }
          else {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                       (pVVar14 + 2));
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (idx_t)pVVar14[2].aux_data.
                        super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
            if (0x3f < iVar18 + 0x3f) {
              iVar17 = pVVar14[1].data.allocated_size;
              uVar19 = 0;
              uVar23 = 0;
              do {
                if (iVar17 == 0) {
                  uVar21 = uVar23 + 0x40;
                  if (iVar18 <= uVar23 + 0x40) {
                    uVar21 = iVar18;
                  }
LAB_008f6823:
                  uVar20 = uVar23;
                  if (uVar23 < uVar21) {
                    do {
                      pdVar3[uVar23] = (char)*(undefined4 *)(pdVar4 + uVar23 * 8) - cVar9;
                      uVar23 = uVar23 + 1;
                      uVar20 = uVar21;
                    } while (uVar21 != uVar23);
                  }
                }
                else {
                  uVar7 = *(ulong *)(iVar17 + uVar19 * 8);
                  uVar21 = uVar23 + 0x40;
                  if (iVar18 <= uVar23 + 0x40) {
                    uVar21 = iVar18;
                  }
                  uVar20 = uVar21;
                  if (uVar7 != 0) {
                    if (uVar7 == 0xffffffffffffffff) goto LAB_008f6823;
                    uVar20 = uVar23;
                    if (uVar23 < uVar21) {
                      uVar22 = 0;
                      do {
                        if ((uVar7 >> (uVar22 & 0x3f) & 1) != 0) {
                          pdVar3[uVar22 + uVar23] =
                               (char)*(undefined4 *)(pdVar4 + uVar22 * 8 + uVar23 * 8) - cVar9;
                        }
                        uVar22 = uVar22 + 1;
                        uVar20 = uVar21;
                      } while (uVar21 - uVar23 != uVar22);
                    }
                  }
                }
                uVar19 = uVar19 + 1;
                uVar23 = uVar20;
              } while (uVar19 != iVar18 + 0x3f >> 6);
            }
          }
          DictionaryVector::VerifyDictionary(pvVar13);
          pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(local_88);
          iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar18,(SelectionVector *)(pVVar14 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar3 = result->data;
      pdVar4 = pvVar13->data;
      puVar5 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *pdVar3 = (char)*(undefined4 *)pdVar4 - cVar9;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar13,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar12 = local_78.sel;
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        p_Var6 = (allocate_function_ptr_t)pSVar12->sel_vector;
        iVar18 = 0;
        do {
          iVar17 = iVar18;
          if (p_Var6 != (allocate_function_ptr_t)0x0) {
            iVar17 = (idx_t)*(uint *)(p_Var6 + iVar18 * 4);
          }
          pdVar3[iVar18] = (char)*(undefined4 *)(local_78.data + iVar17 * 8) - cVar9;
          iVar18 = iVar18 + 1;
        } while (count != iVar18);
      }
    }
    else if (count != 0) {
      p_Var6 = (allocate_function_ptr_t)pSVar12->sel_vector;
      uVar23 = 0;
      do {
        uVar19 = uVar23;
        if (p_Var6 != (allocate_function_ptr_t)0x0) {
          uVar19 = (ulong)*(uint *)(p_Var6 + uVar23 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
             >> (uVar19 & 0x3f) & 1) == 0) {
          _Var16._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var16._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var11 = p_Stack_a0;
            peVar10 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar10;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var11;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var16._M_head_impl =
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var16._M_head_impl;
          }
          bVar8 = (byte)uVar23 & 0x3f;
          _Var16._M_head_impl[uVar23 >> 6] =
               _Var16._M_head_impl[uVar23 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          pdVar3[uVar23] = (char)*(undefined4 *)(local_78.data + uVar19 * 8) - cVar9;
        }
        uVar23 = uVar23 + 1;
      } while (count != uVar23);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}